

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvastexture.cpp
# Opt level: O3

void __thiscall FCanvasTexture::FCanvasTexture(FCanvasTexture *this,char *name,int width,int height)

{
  ushort uVar1;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FCanvasTexture_00709e18;
  FString::operator=(&(this->super_FTexture).Name,name);
  (this->super_FTexture).Width = (WORD)width;
  (this->super_FTexture).Height = (WORD)height;
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  FTexture::CalcBitSize(&this->super_FTexture);
  uVar1 = *(ushort *)&(this->super_FTexture).field_0x31;
  this->DummySpans[0].TopOffset = 0;
  this->DummySpans[0].Length = (WORD)height;
  *(undefined8 *)(this->DummySpans + 1) = 0x100000100000000;
  (this->super_FTexture).UseType = '\x01';
  this->Canvas = (DSimpleCanvas *)0x0;
  *(ushort *)&(this->super_FTexture).field_0x31 = uVar1 & 0xffd7 | 0x20;
  return;
}

Assistant:

FCanvasTexture::FCanvasTexture (const char *name, int width, int height)
{
	Name = name;
	Width = width;
	Height = height;
	LeftOffset = TopOffset = 0;
	CalcBitSize ();

	bMasked = false;
	DummySpans[0].TopOffset = 0;
	DummySpans[0].Length = height;
	DummySpans[1].TopOffset = 0;
	DummySpans[1].Length = 0;
	UseType = TEX_Wall;
	Canvas = NULL;
	bNeedsUpdate = true;
	bDidUpdate = false;
	bHasCanvas = true;
	bFirstUpdate = true;
	bPixelsAllocated = false;
}